

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int lyp_check_status(uint16_t flags1,lys_module *mod1,char *name1,uint16_t flags2,lys_module *mod2,
                    char *name2,lys_node *node)

{
  ushort uVar1;
  ushort uVar2;
  lys_module *plVar3;
  lys_module *plVar4;
  LY_VLOG_ELEM elem_type;
  char *pcVar5;
  char *pcVar6;
  uint16_t flg2;
  uint16_t flg1;
  char *name2_local;
  lys_module *mod2_local;
  uint16_t flags2_local;
  char *name1_local;
  lys_module *mod1_local;
  uint16_t flags1_local;
  
  if ((flags1 & 0x38) == 0) {
    uVar1 = 8;
  }
  else {
    uVar1 = flags1 & 0x38;
  }
  if ((flags2 & 0x38) == 0) {
    uVar2 = 8;
  }
  else {
    uVar2 = flags2 & 0x38;
  }
  if (uVar1 < uVar2) {
    plVar3 = lys_main_module(mod1);
    plVar4 = lys_main_module(mod2);
    if (plVar3 == plVar4) {
      elem_type = LY_VLOG_NONE;
      if (node != (lys_node *)0x0) {
        elem_type = LY_VLOG_LYS;
      }
      pcVar5 = "deprecated";
      if (uVar1 == 8) {
        pcVar5 = "current";
      }
      pcVar6 = "deprecated";
      if (uVar2 == 0x20) {
        pcVar6 = "obsolete";
      }
      ly_vlog(mod1->ctx,LYE_INSTATUS,elem_type,node,pcVar5,name1,"references",pcVar6,name2);
      return 1;
    }
  }
  return 0;
}

Assistant:

int
lyp_check_status(uint16_t flags1, struct lys_module *mod1, const char *name1,
                 uint16_t flags2, struct lys_module *mod2, const char *name2,
                 const struct lys_node *node)
{
    uint16_t flg1, flg2;

    flg1 = (flags1 & LYS_STATUS_MASK) ? (flags1 & LYS_STATUS_MASK) : LYS_STATUS_CURR;
    flg2 = (flags2 & LYS_STATUS_MASK) ? (flags2 & LYS_STATUS_MASK) : LYS_STATUS_CURR;

    if ((flg1 < flg2) && (lys_main_module(mod1) == lys_main_module(mod2))) {
        LOGVAL(mod1->ctx, LYE_INSTATUS, node ? LY_VLOG_LYS : LY_VLOG_NONE, node,
               flg1 == LYS_STATUS_CURR ? "current" : "deprecated", name1, "references",
               flg2 == LYS_STATUS_OBSLT ? "obsolete" : "deprecated", name2);
        return EXIT_FAILURE;
    }

    return EXIT_SUCCESS;
}